

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O1

void Pla_ManConvertToBits(Pla_Man_t *p)

{
  ulong *puVar1;
  size_t __size;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  word *pwVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  
  uVar2 = (p->vCubeLits).nSize;
  if ((p->vCubes).nCap < (int)uVar2) {
    piVar6 = (p->vCubes).pArray;
    __size = (long)(int)uVar2 * 4;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(__size);
    }
    else {
      piVar6 = (int *)realloc(piVar6,__size);
    }
    (p->vCubes).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCubes).nCap = uVar2;
  }
  if (0 < (int)uVar2) {
    piVar6 = (p->vCubes).pArray;
    uVar8 = 0;
    do {
      piVar6[uVar8] = (int)uVar8;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
  }
  (p->vCubes).nSize = uVar2;
  uVar8 = (long)p->nInWords * (long)(int)uVar2;
  iVar11 = (int)uVar8;
  if ((p->vInBits).nCap < iVar11) {
    pwVar7 = (p->vInBits).pArray;
    if (pwVar7 == (word *)0x0) {
      pwVar7 = (word *)malloc(uVar8 * 8);
    }
    else {
      pwVar7 = (word *)realloc(pwVar7,uVar8 * 8);
    }
    (p->vInBits).pArray = pwVar7;
    if (pwVar7 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p->vInBits).nCap = iVar11;
  }
  if (0 < iVar11) {
    memset((p->vInBits).pArray,0,(uVar8 & 0xffffffff) << 3);
  }
  (p->vInBits).nSize = iVar11;
  uVar2 = (p->vCubeLits).nSize;
  if (0 < (int)uVar2) {
    pVVar5 = (p->vCubeLits).pArray;
    uVar8 = 0;
    do {
      uVar3 = pVVar5[uVar8].nSize;
      if (0 < (int)uVar3) {
        uVar9 = p->nInWords * (int)uVar8;
        if (((int)uVar9 < 0) || ((p->vInBits).nSize <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        piVar6 = pVVar5[uVar8].pArray;
        uVar10 = 0;
        do {
          uVar4 = piVar6[uVar10];
          if ((int)uVar4 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf2,"int Abc_Lit2Var(int)");
          }
          puVar1 = (p->vInBits).pArray + (ulong)uVar9 + (ulong)(uVar4 >> 6);
          *puVar1 = *puVar1 | 2 - (ulong)(uVar4 & 1) << ((byte)uVar4 & 0x3e);
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar2);
  }
  return;
}

Assistant:

void Pla_ManConvertToBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube; int i, k, Lit;
    Vec_IntFillNatural( &p->vCubes, Vec_WecSize(&p->vCubeLits) );
    Vec_WrdFill( &p->vInBits,  Pla_ManCubeNum(p) * p->nInWords,  0 );
    Vec_WecForEachLevel( &p->vCubeLits, vCube, i )
        Vec_IntForEachEntry( vCube, Lit, k )
            Pla_CubeSetLit( Pla_CubeIn(p, i), Abc_Lit2Var(Lit), Abc_LitIsCompl(Lit) ? PLA_LIT_ZERO : PLA_LIT_ONE );
}